

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O3

ProgramContext * __thiscall
deqp::gles2::Performance::ShaderCompilerMandelbrotCase::generateShaderData
          (ProgramContext *__return_storage_ptr__,ShaderCompilerMandelbrotCase *this,
          int measurementNdx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  uint uVar5;
  pointer __dest;
  int row;
  long lVar6;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int iVar7;
  long lVar8;
  string *psVar9;
  long lVar10;
  uint cacheAvoidanceID;
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  *pvVar11;
  string *psVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__return_storage_ptr___00;
  undefined4 uVar13;
  Vector<float,_16> result;
  size_type __dnew;
  string nameSpec;
  string local_1b8;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined1 local_178 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  local_118;
  UniformSpec local_f8;
  string local_88;
  undefined1 local_68 [24];
  undefined8 uStack_50;
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  local_48;
  
  psVar12 = &local_1b8;
  psVar9 = &local_1b8;
  cacheAvoidanceID = (this->super_ShaderCompilerCase).m_startHash;
  if ((this->super_ShaderCompilerCase).m_avoidCache == true) {
    uVar5 = ((uint)measurementNdx >> 0x10 ^ measurementNdx ^ 0x3d) * 9;
    uVar5 = (uVar5 >> 4 ^ uVar5) * 0x27d4eb2d;
    cacheAvoidanceID = cacheAvoidanceID ^ uVar5 ^ uVar5 >> 0xf;
  }
  getNameSpecialization_abi_cxx11_(&local_88,(Performance *)(ulong)cacheAvoidanceID,measurementNdx);
  (__return_storage_ptr__->vertShaderSource)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->vertShaderSource).field_2;
  (__return_storage_ptr__->vertShaderSource)._M_string_length = 0;
  (__return_storage_ptr__->vertShaderSource).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->fragShaderSource)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->fragShaderSource).field_2;
  (__return_storage_ptr__->fragShaderSource)._M_string_length = 0;
  (__return_storage_ptr__->fragShaderSource).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  local_158._M_allocated_capacity = 0x210;
  __dest = (pointer)std::__cxx11::string::_M_create((ulong *)&local_1b8,(ulong)&local_158);
  uVar4 = local_158._M_allocated_capacity;
  local_1b8.field_2._M_allocated_capacity = local_158._M_allocated_capacity;
  local_1b8._M_dataplus._M_p = __dest;
  memcpy(__dest,
         "uniform highp mat4 u_mvp${NAME_SPEC};\n\nattribute highp vec4 a_vertex${NAME_SPEC};\nattribute highp vec4 a_coord${NAME_SPEC};\n\nvarying mediump vec2 v_coord${NAME_SPEC};\n\nvoid main(void)\n{\n\tgl_Position = u_mvp${NAME_SPEC} * a_vertex${NAME_SPEC} * (0.95 + 0.05*${FLOAT01});\n\n\tfloat xMin = -2.0;\n\tfloat xMax = +0.5;\n\tfloat yMin = -1.5;\n\tfloat yMax = +1.5;\n\n\tv_coord${NAME_SPEC}.x = a_coord${NAME_SPEC}.x * (xMax - xMin) + xMin;\n\tv_coord${NAME_SPEC}.y = a_coord${NAME_SPEC}.y * (yMax - yMin) + yMin;\n${SEMANTIC_ERROR}}\n${INVALID_CHAR}"
         ,0x210);
  local_1b8._M_string_length = uVar4;
  __dest[uVar4] = '\0';
  specializeShaderSource(&local_f8.name,&local_1b8,cacheAvoidanceID,SHADER_VALIDITY_VALID);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_f8);
  paVar1 = &local_f8.name.field_2;
  iVar7 = extraout_EDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.name._M_dataplus._M_p,local_f8.name.field_2._M_allocated_capacity + 1);
    iVar7 = extraout_EDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    iVar7 = extraout_EDX_01;
  }
  mandelbrotFragmentTemplate_abi_cxx11_
            (&local_1b8,(Performance *)(ulong)(uint)this->m_numFractalIterations,iVar7);
  specializeShaderSource(&local_f8.name,&local_1b8,cacheAvoidanceID,SHADER_VALIDITY_VALID);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->fragShaderSource,(string *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.name._M_dataplus._M_p,local_f8.name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_178._0_8_ = (pointer)0x0;
  local_178._8_8_ = (pointer)0x0;
  local_178._16_8_ = (pointer)0x0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_158,
                 "a_vertex",&local_88);
  local_118.
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xbf800000bf800000;
  local_118.
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f80000000000000;
  local_48.
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f800000bf800000;
  local_48.
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f80000000000000;
  local_68._16_8_ = (pointer)0xbf8000003f800000;
  uStack_50 = 0x3f80000000000000;
  local_68._0_8_ = (pointer)0x3f8000003f800000;
  local_68._8_8_ = (pointer)0x3f80000000000000;
  local_1b8._M_dataplus._M_p = (pointer)0x0;
  local_1b8._M_string_length = 0;
  local_1b8.field_2._M_allocated_capacity = 0;
  local_1b8.field_2._8_8_ = 0;
  local_198 = 0;
  uStack_190 = 0;
  local_188 = 0;
  uStack_180 = 0;
  lVar8 = 0;
  do {
    iVar7 = (int)lVar8;
    pvVar11 = &local_118;
    if (((iVar7 != 0) && (pvVar11 = &local_48, iVar7 != 1)) &&
       (pvVar11 = (vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
                   *)local_68, iVar7 == 2)) {
      pvVar11 = (vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
                 *)(local_68 + 0x10);
    }
    uVar13 = *(undefined4 *)
              ((long)&(pvVar11->
                      super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
                      )._M_impl.super__Vector_impl_data._M_start + 4);
    uVar2 = *(undefined4 *)
             &(pvVar11->
              super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    uVar3 = *(undefined4 *)
             ((long)&(pvVar11->
                     super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
                     )._M_impl.super__Vector_impl_data._M_finish + 4);
    *(undefined4 *)psVar12 =
         *(undefined4 *)
          &(pvVar11->
           super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
           )._M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)((long)psVar12 + 4) = uVar13;
    *(undefined4 *)((long)psVar12 + 8) = uVar2;
    *(undefined4 *)((long)psVar12 + 0xc) = uVar3;
    lVar8 = lVar8 + 1;
    psVar12 = (string *)((long)psVar12 + 0x10);
  } while (lVar8 != 4);
  local_f8.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,local_158._M_allocated_capacity,
             local_158._8_8_ + local_158._M_allocated_capacity);
  local_f8.value.m_data[0xb] = (float)local_188;
  local_f8.value.m_data[0xc] = (float)((ulong)local_188 >> 0x20);
  local_f8.value.m_data[0xd] = (float)uStack_180;
  local_f8.value.m_data[0xe] = (float)((ulong)uStack_180 >> 0x20);
  local_f8.value.m_data[7] = (float)local_198;
  local_f8.value.m_data[8] = (float)((ulong)local_198 >> 0x20);
  local_f8.value.m_data[9] = (float)uStack_190;
  local_f8.value.m_data[10] = (float)((ulong)uStack_190 >> 0x20);
  local_f8.value.m_data[3] = (float)local_1b8.field_2._M_allocated_capacity;
  local_f8.value.m_data[4] = (float)((ulong)local_1b8.field_2._0_8_ >> 0x20);
  local_f8.value.m_data[5] = (float)local_1b8.field_2._8_8_;
  local_f8.value.m_data[6] = (float)((ulong)local_1b8.field_2._8_8_ >> 0x20);
  local_f8.type = (Type)local_1b8._M_dataplus._M_p;
  local_f8.value.m_data[0] = (float)((ulong)local_1b8._M_dataplus._M_p >> 0x20);
  local_f8.value.m_data[1] = (float)local_1b8._M_string_length;
  local_f8.value.m_data[2] = (float)(local_1b8._M_string_length >> 0x20);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>
            ((vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
              *)local_178,(AttribSpec *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.name._M_dataplus._M_p,local_f8.name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_allocated_capacity != &local_148) {
    operator_delete((void *)local_158._M_allocated_capacity,local_148._M_allocated_capacity + 1);
  }
  __return_storage_ptr___00 = &local_158;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr___00,"a_coord",&local_88);
  local_118.
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f80000000000000;
  local_48.
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f80000000000000;
  local_48.
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f80000000000000;
  local_68._16_8_ = (pointer)0x3f800000;
  uStack_50 = 0x3f80000000000000;
  local_68._0_8_ = (pointer)0x3f8000003f800000;
  local_68._8_8_ = (pointer)0x3f80000000000000;
  local_1b8._M_dataplus._M_p = (pointer)0x0;
  local_1b8._M_string_length = 0;
  local_1b8.field_2._M_allocated_capacity = 0;
  local_1b8.field_2._8_8_ = 0;
  local_198 = 0;
  uStack_190 = 0;
  local_188 = 0;
  uStack_180 = 0;
  lVar8 = 0;
  do {
    iVar7 = (int)lVar8;
    pvVar11 = &local_118;
    if (((iVar7 != 0) && (pvVar11 = &local_48, iVar7 != 1)) &&
       (pvVar11 = (vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
                   *)local_68, iVar7 == 2)) {
      pvVar11 = (vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
                 *)(local_68 + 0x10);
    }
    uVar13 = *(undefined4 *)
              ((long)&(pvVar11->
                      super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
                      )._M_impl.super__Vector_impl_data._M_start + 4);
    uVar2 = *(undefined4 *)
             &(pvVar11->
              super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    uVar3 = *(undefined4 *)
             ((long)&(pvVar11->
                     super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
                     )._M_impl.super__Vector_impl_data._M_finish + 4);
    *(undefined4 *)psVar9 =
         *(undefined4 *)
          &(pvVar11->
           super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
           )._M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)((long)psVar9 + 4) = uVar13;
    *(undefined4 *)((long)psVar9 + 8) = uVar2;
    *(undefined4 *)((long)psVar9 + 0xc) = uVar3;
    lVar8 = lVar8 + 1;
    psVar9 = (string *)((long)psVar9 + 0x10);
  } while (lVar8 != 4);
  local_f8.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,local_158._M_allocated_capacity,
             local_158._8_8_ + local_158._M_allocated_capacity);
  local_f8.value.m_data[0xb] = (float)local_188;
  local_f8.value.m_data[0xc] = (float)((ulong)local_188 >> 0x20);
  local_f8.value.m_data[0xd] = (float)uStack_180;
  local_f8.value.m_data[0xe] = (float)((ulong)uStack_180 >> 0x20);
  local_f8.value.m_data[7] = (float)local_198;
  local_f8.value.m_data[8] = (float)((ulong)local_198 >> 0x20);
  local_f8.value.m_data[9] = (float)uStack_190;
  local_f8.value.m_data[10] = (float)((ulong)uStack_190 >> 0x20);
  local_f8.value.m_data[3] = (float)local_1b8.field_2._M_allocated_capacity;
  local_f8.value.m_data[4] = (float)((ulong)local_1b8.field_2._0_8_ >> 0x20);
  local_f8.value.m_data[5] = (float)local_1b8.field_2._8_8_;
  local_f8.value.m_data[6] = (float)((ulong)local_1b8.field_2._8_8_ >> 0x20);
  local_f8.type = (Type)local_1b8._M_dataplus._M_p;
  local_f8.value.m_data[0] = (float)((ulong)local_1b8._M_dataplus._M_p >> 0x20);
  local_f8.value.m_data[1] = (float)local_1b8._M_string_length;
  local_f8.value.m_data[2] = (float)(local_1b8._M_string_length >> 0x20);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>
            ((vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
              *)local_178,(AttribSpec *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.name._M_dataplus._M_p,local_f8.name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_allocated_capacity != &local_148) {
    operator_delete((void *)local_158._M_allocated_capacity,local_148._M_allocated_capacity + 1);
  }
  local_f8.name.field_2._M_allocated_capacity =
       (size_type)
       (__return_storage_ptr__->vertexAttributes).
       super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_178._16_8_;
  local_f8.name._M_dataplus._M_p =
       (pointer)(__return_storage_ptr__->vertexAttributes).
                super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_f8.name._M_string_length =
       (size_type)
       (__return_storage_ptr__->vertexAttributes).
       super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_178._0_8_;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_178._8_8_;
  local_178._0_8_ = (pointer)0x0;
  local_178._8_8_ = (pointer)0x0;
  local_178._16_8_ = (pointer)0x0;
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ::~vector((vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
             *)&local_f8);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ::~vector((vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
             *)local_178);
  local_118.
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                 "u_mvp",&local_88);
  local_128 = 0;
  uStack_120 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_148._M_allocated_capacity = 0;
  local_148._8_8_ = 0;
  local_158._M_allocated_capacity = 0;
  local_158._8_8_ = 0;
  lVar8 = 0;
  lVar6 = 0;
  do {
    lVar10 = 0;
    do {
      uVar13 = 0x3f800000;
      if (lVar8 != lVar10) {
        uVar13 = 0;
      }
      *(undefined4 *)((long)__return_storage_ptr___00 + lVar10) = uVar13;
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x40);
    lVar6 = lVar6 + 1;
    __return_storage_ptr___00 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)((long)__return_storage_ptr___00 + 4);
    lVar8 = lVar8 + 0x10;
  } while (lVar6 != 4);
  lVar8 = 0;
  do {
    uVar13 = *(undefined4 *)((long)&local_158 + lVar8 + 4);
    uVar2 = *(undefined4 *)((long)&local_158 + lVar8 + 8);
    uVar3 = *(undefined4 *)((long)&local_158 + lVar8 + 0xc);
    *(undefined4 *)((long)&local_1b8._M_dataplus._M_p + lVar8) =
         *(undefined4 *)((long)&local_158 + lVar8);
    *(undefined4 *)((long)&local_1b8._M_dataplus._M_p + lVar8 + 4) = uVar13;
    *(undefined4 *)((long)&local_1b8._M_string_length + lVar8) = uVar2;
    *(undefined4 *)((long)&local_1b8._M_string_length + lVar8 + 4) = uVar3;
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x40);
  local_f8.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,local_178._0_8_,
             (pointer)(local_178._0_8_ +
                      (long)((Vector<float,_16> *)(local_178._8_8_ + 0x20) + -1) + 0x20));
  local_f8.type = TYPE_MAT4;
  local_f8.value.m_data[0] = SUB84(local_1b8._M_dataplus._M_p,0);
  local_f8.value.m_data[1] = (float)((ulong)local_1b8._M_dataplus._M_p >> 0x20);
  local_f8.value.m_data[2] = (float)local_1b8._M_string_length;
  local_f8.value.m_data[3] = (float)(local_1b8._M_string_length >> 0x20);
  local_f8.value.m_data[4] = (float)local_1b8.field_2._M_allocated_capacity;
  local_f8.value.m_data[5] = (float)((ulong)local_1b8.field_2._0_8_ >> 0x20);
  local_f8.value.m_data[6] = (float)local_1b8.field_2._8_8_;
  local_f8.value.m_data[7] = (float)((ulong)local_1b8.field_2._8_8_ >> 0x20);
  local_f8.value.m_data[8] = (float)local_198;
  local_f8.value.m_data[9] = (float)((ulong)local_198 >> 0x20);
  local_f8.value.m_data[10] = (float)uStack_190;
  local_f8.value.m_data[0xb] = (float)((ulong)uStack_190 >> 0x20);
  local_f8.value.m_data[0xc] = (float)local_188;
  local_f8.value.m_data[0xd] = (float)((ulong)local_188 >> 0x20);
  local_f8.value.m_data[0xe] = (float)uStack_180;
  local_f8.value.m_data[0xf] = (float)((ulong)uStack_180 >> 0x20);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>(&local_118,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.name._M_dataplus._M_p,
                    (ulong)(local_f8.name.field_2._M_allocated_capacity + 1));
  }
  if ((pointer)local_178._0_8_ != (pointer)(local_178 + 0x10)) {
    operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
  }
  local_f8.name.field_2._M_allocated_capacity =
       (size_type)
       (__return_storage_ptr__->uniforms).
       super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_118.
       super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_f8.name._M_dataplus._M_p =
       (pointer)(__return_storage_ptr__->uniforms).
                super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_f8.name._M_string_length =
       (size_type)
       (__return_storage_ptr__->uniforms).
       super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_118.
       super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_118.
       super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_118.
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::~vector((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
             *)&local_f8);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::~vector(&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

ShaderCompilerCase::ProgramContext ShaderCompilerMandelbrotCase::generateShaderData (int measurementNdx) const
{
	deUint32		specID		= getSpecializationID(measurementNdx);
	string			nameSpec	= getNameSpecialization(specID);
	ProgramContext	result;

	result.vertShaderSource = specializeShaderSource(mandelbrotVertexTemplate(), specID, SHADER_VALIDITY_VALID);
	result.fragShaderSource = specializeShaderSource(mandelbrotFragmentTemplate(m_numFractalIterations), specID, SHADER_VALIDITY_VALID);

	result.vertexAttributes = mandelbrotShaderAttributes(nameSpec);
	result.uniforms = mandelbrotShaderUniforms(nameSpec);

	return result;
}